

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_loop_fixup(ASMState *as)

{
  MCode *pMVar1;
  MCode *pMVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  MCode *local_28;
  MCode *newloop;
  MCode *target;
  MCode *p;
  ASMState *as_local;
  
  pMVar1 = as->mctop;
  pMVar2 = as->mcp;
  if (as->realign == (MCode *)0x0) {
    pMVar1[-5] = 0xe9;
    iVar5 = (int)pMVar2;
    if (as->loopinv == 0) {
      *(int *)(pMVar1 + -4) = iVar5 - (int)pMVar1;
      local_28 = pMVar2 + 3;
      target = pMVar1;
    }
    else {
      target = pMVar1 + -5;
      local_28 = pMVar2 + 4;
      *(int *)(pMVar1 + -9) = iVar5 - (int)target;
      if (as->loopinv == 2) {
        *(int *)(pMVar1 + -0xf) = (iVar5 - (int)target) + 6;
        local_28 = pMVar2 + 8;
      }
    }
    if (target + -0x80 <= local_28) {
      as->realign = local_28;
      as->curins = as->stopins;
      as->T->nins = as->orignins;
    }
  }
  else {
    as->realign = (MCode *)0x0;
    cVar3 = (char)pMVar2;
    if (as->loopinv == 0) {
      pMVar1[-1] = cVar3 - (char)pMVar1;
      pMVar1[-2] = 0xeb;
    }
    else {
      pMVar1[-5] = 0xe9;
      cVar4 = (char)(pMVar1 + -5);
      pMVar1[-6] = cVar3 - cVar4;
      if (as->loopinv == 2) {
        pMVar1[-8] = (cVar3 - cVar4) + '\x02';
      }
    }
  }
  return;
}

Assistant:

static void asm_loop_fixup(ASMState *as)
{
  MCode *p = as->mctop;
  MCode *target = as->mcp;
  if (as->realign) {  /* Realigned loops use short jumps. */
    as->realign = NULL;  /* Stop another retry. */
    lj_assertA(((intptr_t)target & 15) == 0, "loop realign failed");
    if (as->loopinv) {  /* Inverted loop branch? */
      p -= 5;
      p[0] = XI_JMP;
      lj_assertA(target - p >= -128, "loop realign failed");
      p[-1] = (MCode)(target - p);  /* Patch sjcc. */
      if (as->loopinv == 2)
	p[-3] = (MCode)(target - p + 2);  /* Patch opt. short jp. */
    } else {
      lj_assertA(target - p >= -128, "loop realign failed");
      p[-1] = (MCode)(int8_t)(target - p);  /* Patch short jmp. */
      p[-2] = XI_JMPs;
    }
  } else {
    MCode *newloop;
    p[-5] = XI_JMP;
    if (as->loopinv) {  /* Inverted loop branch? */
      /* asm_guardcc already inverted the jcc and patched the jmp. */
      p -= 5;
      newloop = target+4;
      *(int32_t *)(p-4) = (int32_t)(target - p);  /* Patch jcc. */
      if (as->loopinv == 2) {
	*(int32_t *)(p-10) = (int32_t)(target - p + 6);  /* Patch opt. jp. */
	newloop = target+8;
      }
    } else {  /* Otherwise just patch jmp. */
      *(int32_t *)(p-4) = (int32_t)(target - p);
      newloop = target+3;
    }
    /* Realign small loops and shorten the loop branch. */
    if (newloop >= p - 128) {
      as->realign = newloop;  /* Force a retry and remember alignment. */
      as->curins = as->stopins;  /* Abort asm_trace now. */
      as->T->nins = as->orignins;  /* Remove any added renames. */
    }
  }
}